

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTest.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2ec4d::TestTestReflectsSpecifiedSuiteName::RunImpl
          (TestTestReflectsSpecifiedSuiteName *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  Test test;
  TestDetails TStack_68;
  Test local_48;
  
  UnitTest::Test::Test(&local_48,"test","testSuite","",0);
  if (local_48.m_details.suiteName == (char *)0x0) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_68,*ppTVar3,0x6d);
    UnitTest::TestResults::OnTestFailure(pTVar1,&TStack_68,"test.m_details.suiteName != NULL");
  }
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&TStack_68,*ppTVar3,0x6e);
  UnitTest::CheckEqual(pTVar1,"testSuite",local_48.m_details.suiteName,&TStack_68);
  UnitTest::Test::~Test(&local_48);
  return;
}

Assistant:

TEST(TestReflectsSpecifiedSuiteName)
{
    Test test("test", "testSuite");
    CHECK(test.m_details.suiteName != NULL);
    CHECK_EQUAL("testSuite", test.m_details.suiteName);
}